

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall
mp::BasicSolver::BasicSolver
          (BasicSolver *this,CStringRef name,CStringRef long_name,long date,int flags)

{
  _Rb_tree_header *p_Var1;
  rep rVar2;
  
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&PTR__ErrorHandler_005d38a0;
  (this->super_OutputHandler)._vptr_OutputHandler = (_func_int **)&PTR__OutputHandler_005d38c8;
  (this->super_OutputHandler).has_output = false;
  (this->super_OutputHandler).banner_size = 0;
  (this->super_Interrupter)._vptr_Interrupter = (_func_int **)&PTR__Interrupter_005d3870;
  (this->super_SolverOptionManager)._vptr_SolverOptionManager =
       (_func_int **)&PTR__SolverOptionManager_005d3510;
  (this->super_SolverOptionManager).option_header_._M_dataplus._M_p =
       (pointer)&(this->super_SolverOptionManager).option_header_.field_2;
  (this->super_SolverOptionManager).option_header_._M_string_length = 0;
  (this->super_SolverOptionManager).option_header_.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->super_SolverOptionManager).options_._M_t._M_impl.super__Rb_tree_header;
  (this->super_SolverOptionManager).options_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_SolverOptionManager).options_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_SolverOptionManager).options_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_SolverOptionManager).options_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_SolverOptionManager).options_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  SolveResultRegistry::SolveResultRegistry(&this->super_SolveResultRegistry);
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&PTR__BasicSolver_005d3380;
  (this->super_OutputHandler)._vptr_OutputHandler = (_func_int **)&PTR__BasicSolver_005d33f0;
  (this->super_Interrupter)._vptr_Interrupter = (_func_int **)&PTR__BasicSolver_005d3418;
  (this->super_SolverOptionManager)._vptr_SolverOptionManager =
       (_func_int **)&PTR__BasicSolver_005d3448;
  (this->super_SolveResultRegistry)._vptr_SolveResultRegistry =
       (_func_int **)&PTR__BasicSolver_005d3468;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->long_name_)._M_dataplus._M_p = (pointer)&(this->long_name_).field_2;
  (this->long_name_)._M_string_length = 0;
  (this->long_name_).field_2._M_local_buf[0] = '\0';
  (this->exe_path_)._M_dataplus._M_p = (pointer)&(this->exe_path_).field_2;
  (this->exe_path_)._M_string_length = 0;
  (this->exe_path_).field_2._M_local_buf[0] = '\0';
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  (this->version_)._M_string_length = 0;
  (this->version_).field_2._M_local_buf[0] = '\0';
  (this->stub_)._M_dataplus._M_p = (pointer)&(this->stub_).field_2;
  (this->stub_)._M_string_length = 0;
  (this->stub_).field_2._M_local_buf[0] = '\0';
  (this->license_info_)._M_dataplus._M_p = (pointer)&(this->license_info_).field_2;
  (this->license_info_)._M_string_length = 0;
  (this->license_info_).field_2._M_local_buf[0] = '\0';
  this->date_ = 0;
  this->wantsol_ = 0;
  this->obj_precision_ = -1;
  this->objno_ = -1;
  this->obj_added_ = false;
  this->opts_read_ = false;
  this->bool_options_ = 0;
  this->option_flag_save_ = 0;
  (this->option_file_save_)._M_dataplus._M_p = (pointer)&(this->option_file_save_).field_2;
  (this->option_file_save_)._M_string_length = 0;
  (this->option_file_save_).field_2._M_local_buf[0] = '\0';
  (this->solution_stub_)._M_dataplus._M_p = (pointer)&(this->solution_stub_).field_2;
  (this->solution_stub_)._M_string_length = 0;
  (this->solution_stub_).field_2._M_local_buf[0] = '\0';
  this->count_solutions_ = false;
  this->read_flags_ = 0;
  this->verbose_ = false;
  this->debug_ = false;
  this->report_uncertain_sol_ = true;
  this->timing_ = 0;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->stats_).time.__d.__r = rVar2;
  (this->stats_).setup_time = 0.0;
  (this->stats_).solution_time = 0.0;
  (this->stats_).read_time = 0.0;
  (this->stats_).conversion_time = 0.0;
  *(undefined8 *)((long)&(this->stats_).conversion_time + 4) = 0;
  *(undefined8 *)((long)&(this->stats_).output_time + 4) = 0;
  *(undefined8 *)&(this->warn_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->warn_cb_).super__Function_base._M_functor + 8) = 0;
  (this->warn_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->warn_cb_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)((long)&(this->warn_cb_)._M_invoker + 5) = 0;
  this->multiobj_weight_ = 2;
  this->has_errors_ = false;
  this->output_handler_ = &this->super_OutputHandler;
  this->error_handler_ = &this->super_ErrorHandler;
  this->interrupter_ = &this->super_Interrupter;
  p_Var1 = &(this->warnings_)._M_t._M_impl.super__Rb_tree_header;
  (this->warnings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->warnings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->warnings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->warnings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->warnings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->constr_descr_header_)._M_dataplus._M_p = (pointer)&(this->constr_descr_header_).field_2;
  (this->constr_descr_header_)._M_string_length = 0;
  (this->constr_descr_header_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->constr_descr_)._M_t._M_impl.super__Rb_tree_header;
  (this->constr_descr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->constr_descr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->constr_descr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->constr_descr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->constr_descr_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  InitMetaInfoAndOptions(this,name,long_name,date,flags);
  return;
}

Assistant:

BasicSolver::BasicSolver(
    fmt::CStringRef name, fmt::CStringRef long_name, long date, int flags) {
  InitMetaInfoAndOptions(name, long_name, date, flags);
}